

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecAtt.h
# Opt level: O0

void * Vec_AttEntry(Vec_Att_t *p,int i)

{
  void *pvVar1;
  int local_24;
  int i_local;
  Vec_Att_t *p_local;
  
  if (p->pArrayPtr != (void **)0x0) {
    if (p->nCap <= i) {
      if (i < p->nCap * 2) {
        local_24 = p->nCap << 1;
      }
      else {
        local_24 = i + 10;
      }
      Vec_AttGrow(p,local_24);
    }
    if ((p->pArrayPtr[i] == (void *)0x0) && (p->pFuncStartObj != (_func_void_ptr_void_ptr *)0x0)) {
      pvVar1 = (*p->pFuncStartObj)(p->pMan);
      p->pArrayPtr[i] = pvVar1;
    }
    return p->pArrayPtr[i];
  }
  __assert_fail("p->pArrayPtr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecAtt.h"
                ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
}

Assistant:

static inline void * Vec_AttEntry( Vec_Att_t * p, int i )
{
    assert( p->pArrayPtr );
    if ( i >= p->nCap )
        Vec_AttGrow( p, (2 * p->nCap > i)? 2 * p->nCap : i + 10 );
    if ( p->pArrayPtr[i] == NULL && p->pFuncStartObj )
        p->pArrayPtr[i] = p->pFuncStartObj( p->pMan );
    return p->pArrayPtr[i];
}